

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.hpp
# Opt level: O1

string * __thiscall
duckdb::FullLinePosition::
ReconstructCurrentLine<std::map<unsigned_long,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>>>>>
          (string *__return_storage_ptr__,FullLinePosition *this,bool *first_char_nl,
          map<unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>_>
          *buffer_handles,bool reconstruct_line)

{
  idx_t *__k;
  _Rb_tree_header *p_Var1;
  data_t dVar2;
  idx_t iVar3;
  data_ptr_t pdVar4;
  mapped_type *pmVar5;
  CSVBufferHandle *pCVar6;
  size_type *psVar7;
  bool bVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  _Base_ptr p_Var10;
  ulong uVar11;
  _Base_ptr p_Var12;
  char cVar13;
  undefined7 in_register_00000081;
  _Base_ptr p_Var14;
  optional_ptr<duckdb::FileBuffer,_true> *poVar15;
  ulong uVar16;
  string local_58;
  string *local_38;
  
  if (((int)CONCAT71(in_register_00000081,reconstruct_line) == 0) ||
     ((((this->begin).buffer_pos == (this->end).buffer_pos &&
       ((this->begin).buffer_idx == (this->end).buffer_idx)) &&
      ((this->begin).buffer_size == (this->end).buffer_size)))) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  uVar16 = (this->begin).buffer_idx;
  uVar11 = (this->end).buffer_idx;
  __k = &(this->begin).buffer_idx;
  p_Var1 = &(buffer_handles->_M_t)._M_impl.super__Rb_tree_header;
  p_Var10 = (buffer_handles->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  cVar13 = (char)&local_58;
  p_Var12 = &p_Var1->_M_header;
  p_Var14 = p_Var10;
  local_38 = __return_storage_ptr__;
  if (uVar11 == uVar16) {
    for (; (_Rb_tree_header *)p_Var10 != (_Rb_tree_header *)0x0;
        p_Var10 = (&p_Var10->_M_left)[*(ulong *)(p_Var10 + 1) < uVar11]) {
      if (*(ulong *)(p_Var10 + 1) >= uVar11) {
        p_Var12 = p_Var10;
      }
    }
    p_Var10 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var12 != p_Var1) &&
       (p_Var10 = p_Var12, uVar11 < *(ulong *)(p_Var12 + 1))) {
      p_Var10 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var10 != p_Var1) {
      pmVar5 = ::std::
               map<unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>_>
               ::operator[](buffer_handles,__k);
      pCVar6 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(pmVar5);
      poVar15 = &(pCVar6->handle).node;
      optional_ptr<duckdb::FileBuffer,_true>::CheckValid(poVar15);
      iVar3 = (this->begin).buffer_pos;
      dVar2 = poVar15->ptr->buffer[iVar3];
      bVar8 = dVar2 == '\r' || dVar2 == '\n';
      *first_char_nl = bVar8;
      uVar16 = bVar8 + iVar3;
      if (uVar16 < (this->end).buffer_pos) {
        do {
          ::std::__cxx11::string::push_back(cVar13);
          uVar16 = uVar16 + 1;
        } while (uVar16 < (this->end).buffer_pos);
      }
LAB_0180fd48:
      SanitizeError(&local_58);
      (local_38->_M_dataplus)._M_p = (pointer)&local_38->field_2;
      paVar9 = &local_58.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p == paVar9) {
        (local_38->field_2)._M_allocated_capacity =
             CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,local_58.field_2._M_local_buf[0])
        ;
        *(undefined8 *)((long)&local_38->field_2 + 8) = local_58.field_2._8_8_;
      }
      else {
        (local_38->_M_dataplus)._M_p = local_58._M_dataplus._M_p;
        (local_38->field_2)._M_allocated_capacity =
             CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,local_58.field_2._M_local_buf[0])
        ;
      }
      psVar7 = &local_58._M_string_length;
      local_38->_M_string_length = local_58._M_string_length;
      __return_storage_ptr__ = local_38;
      goto LAB_0180fda3;
    }
  }
  else {
    for (; p_Var14 != (_Base_ptr)0x0;
        p_Var14 = (&p_Var14->_M_left)[*(ulong *)(p_Var14 + 1) < uVar16]) {
      if (*(ulong *)(p_Var14 + 1) >= uVar16) {
        p_Var12 = p_Var14;
      }
    }
    p_Var14 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var12 != p_Var1) &&
       (p_Var14 = p_Var12, uVar16 < *(ulong *)(p_Var12 + 1))) {
      p_Var14 = &p_Var1->_M_header;
    }
    p_Var12 = &p_Var1->_M_header;
    if ((_Rb_tree_header *)p_Var14 != p_Var1) {
      for (; p_Var10 != (_Base_ptr)0x0;
          p_Var10 = (&p_Var10->_M_left)[*(ulong *)(p_Var10 + 1) < uVar11]) {
        if (*(ulong *)(p_Var10 + 1) >= uVar11) {
          p_Var12 = p_Var10;
        }
      }
      p_Var10 = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var12 != p_Var1) &&
         (p_Var10 = p_Var12, uVar11 < *(ulong *)(p_Var12 + 1))) {
        p_Var10 = &p_Var1->_M_header;
      }
      if ((_Rb_tree_header *)p_Var10 != p_Var1) {
        pmVar5 = ::std::
                 map<unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>_>
                 ::operator[](buffer_handles,__k);
        pCVar6 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(pmVar5);
        poVar15 = &(pCVar6->handle).node;
        optional_ptr<duckdb::FileBuffer,_true>::CheckValid(poVar15);
        pdVar4 = poVar15->ptr->buffer;
        pmVar5 = ::std::
                 map<unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>_>
                 ::operator[](buffer_handles,__k);
        pCVar6 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(pmVar5);
        uVar16 = pCVar6->actual_size;
        pmVar5 = ::std::
                 map<unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>_>
                 ::operator[](buffer_handles,&(this->end).buffer_idx);
        pCVar6 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(pmVar5);
        optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(pCVar6->handle).node);
        iVar3 = (this->begin).buffer_pos;
        dVar2 = pdVar4[iVar3];
        bVar8 = dVar2 == '\r' || dVar2 == '\n';
        *first_char_nl = bVar8;
        for (uVar11 = bVar8 + iVar3; uVar11 < uVar16; uVar11 = uVar11 + 1) {
          ::std::__cxx11::string::push_back(cVar13);
        }
        if ((this->end).buffer_pos != 0) {
          uVar16 = 0;
          do {
            ::std::__cxx11::string::push_back(cVar13);
            uVar16 = uVar16 + 1;
          } while (uVar16 < (this->end).buffer_pos);
        }
        goto LAB_0180fd48;
      }
    }
  }
  paVar9 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar9;
  psVar7 = &__return_storage_ptr__->_M_string_length;
LAB_0180fda3:
  *psVar7 = 0;
  paVar9->_M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

string ReconstructCurrentLine(bool &first_char_nl, T &buffer_handles, bool reconstruct_line) const {
		if (!reconstruct_line || begin == end) {
			return {};
		}
		string result;
		if (end.buffer_idx == begin.buffer_idx) {
			if (buffer_handles.find(end.buffer_idx) == buffer_handles.end()) {
				return {};
			}
			auto buffer = buffer_handles[begin.buffer_idx]->Ptr();
			first_char_nl = buffer[begin.buffer_pos] == '\n' || buffer[begin.buffer_pos] == '\r';
			for (idx_t i = begin.buffer_pos + first_char_nl; i < end.buffer_pos; i++) {
				result += buffer[i];
			}
		} else {
			if (buffer_handles.find(begin.buffer_idx) == buffer_handles.end() ||
			    buffer_handles.find(end.buffer_idx) == buffer_handles.end()) {
				return {};
			}
			auto first_buffer = buffer_handles[begin.buffer_idx]->Ptr();
			auto first_buffer_size = buffer_handles[begin.buffer_idx]->actual_size;
			auto second_buffer = buffer_handles[end.buffer_idx]->Ptr();
			first_char_nl = first_buffer[begin.buffer_pos] == '\n' || first_buffer[begin.buffer_pos] == '\r';
			for (idx_t i = begin.buffer_pos + first_char_nl; i < first_buffer_size; i++) {
				result += first_buffer[i];
			}
			for (idx_t i = 0; i < end.buffer_pos; i++) {
				result += second_buffer[i];
			}
		}
		// sanitize borked line
		SanitizeError(result);
		return result;
	}